

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall pbrt::MetalMaterial::MetalMaterial(MetalMaterial *this,string *name)

{
  undefined8 *in_RDI;
  Spectrum *this_00;
  string *in_stack_ffffffffffffffc8;
  Material *in_stack_ffffffffffffffd0;
  
  Material::Material(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *in_RDI = &PTR_toString_abi_cxx11__002182b0;
  *(undefined4 *)(in_RDI + 7) = 0x3c23d70a;
  this_00 = (Spectrum *)(in_RDI + 8);
  std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x1308c6);
  *(undefined4 *)(in_RDI + 10) = 0;
  std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x1308e0);
  *(undefined4 *)(in_RDI + 0xd) = 0;
  std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x1308fa);
  *(undefined1 *)(in_RDI + 0x10) = 1;
  math::vec3f::vec3f((vec3f *)((long)in_RDI + 0x84),0.21221054,0.91804785,1.1000715);
  Spectrum::Spectrum(this_00);
  math::vec3f::vec3f((vec3f *)(in_RDI + 0x18),3.9132357,2.4519274,2.1321275);
  Spectrum::Spectrum(this_00);
  std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x13098e);
  return;
}

Assistant:

MetalMaterial(const std::string &name = "") : Material(name) {}